

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.cc
# Opt level: O0

void * OPENSSL_sk_delete_ptr(OPENSSL_STACK *sk,void *p)

{
  void *pvVar1;
  ulong local_28;
  size_t i;
  void *p_local;
  OPENSSL_STACK *sk_local;
  
  if (sk != (OPENSSL_STACK *)0x0) {
    for (local_28 = 0; local_28 < sk->num; local_28 = local_28 + 1) {
      if (sk->data[local_28] == p) {
        pvVar1 = OPENSSL_sk_delete(sk,local_28);
        return pvVar1;
      }
    }
  }
  return (void *)0x0;
}

Assistant:

void *OPENSSL_sk_delete_ptr(OPENSSL_STACK *sk, const void *p) {
  if (sk == NULL) {
    return NULL;
  }

  for (size_t i = 0; i < sk->num; i++) {
    if (sk->data[i] == p) {
      return OPENSSL_sk_delete(sk, i);
    }
  }

  return NULL;
}